

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O1

void __thiscall NPC_Data::LoadShopDrop(NPC_Data *this)

{
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  *this_00;
  vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  *this_01;
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  *this_02;
  unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_> *this_03;
  char cVar1;
  short sVar2;
  World *pWVar3;
  pointer puVar4;
  void *pvVar5;
  pointer puVar6;
  pointer puVar7;
  NPC_Shop_Craft_Item *__ptr;
  pointer puVar8;
  _Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_> __ptr_00;
  _Head_base<0UL,_NPC_Citizenship_*,_false> _Var9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  undefined8 uVar16;
  NPC_Data *pNVar17;
  int iVar18;
  int iVar19;
  iterator iVar20;
  undefined2 *puVar21;
  mapped_type *pmVar22;
  ENF_Data *pEVar23;
  long *plVar24;
  ushort *puVar25;
  NPC_Data *pNVar26;
  _Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_> _Var27;
  Home *pHVar28;
  pointer pbVar29;
  size_type *psVar30;
  pointer pbVar31;
  int subject;
  int subject_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int subject_01;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  _Hash_node_base *p_Var35;
  ulong uVar36;
  long lVar37;
  int ii;
  long lVar38;
  bool bVar39;
  double dVar40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> ingredients;
  unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_> item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts_4;
  undefined1 local_168 [32];
  NPC_Data *local_148;
  vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  *local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  local_138;
  undefined1 local_d0 [32];
  string local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string local_78;
  double local_58;
  long *local_50 [2];
  long local_40 [2];
  
  UnloadShopDrop(this);
  pWVar3 = this->world;
  local_148 = this;
  util::to_string_abi_cxx11_(&local_138.first,(util *)(ulong)(uint)(int)this->id,subject);
  iVar20 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&pWVar3->drops_config,&local_138.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
    operator_delete(local_138.first._M_dataplus._M_p,
                    local_138.first.field_2._M_allocated_capacity + 1);
  }
  if (iVar20.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_0017ea03:
    pWVar3 = local_148->world;
    local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Version","");
    pmVar22 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->shops_config,&local_138.first);
    iVar18 = util::variant::GetInt(pmVar22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
      operator_delete(local_138.first._M_dataplus._M_p,
                      local_138.first.field_2._M_allocated_capacity + 1);
    }
    pNVar17 = local_148;
    pNVar26 = local_148;
    if (1 < iVar18) {
      pEVar23 = ::ENF::Get(local_148->world->enf,(int)local_148->id);
      pNVar26 = (NPC_Data *)&pEVar23->vendor_id;
    }
    sVar2 = pNVar26->id;
    pEVar23 = ::ENF::Get(pNVar17->world->enf,(int)pNVar17->id);
    if ((pEVar23->type == Shop) && (0 < sVar2)) {
      uVar34 = (uint)sVar2;
      pWVar3 = local_148->world;
      util::to_string_abi_cxx11_((string *)local_d0,(util *)(ulong)uVar34,subject_00);
      plVar24 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_168._0_8_ = local_168 + 0x10;
      pbVar29 = (pointer)(plVar24 + 2);
      if ((pointer)*plVar24 == pbVar29) {
        local_168._16_8_ = (pbVar29->_M_dataplus)._M_p;
        local_168._24_8_ = plVar24[3];
      }
      else {
        local_168._16_8_ = (pbVar29->_M_dataplus)._M_p;
        local_168._0_8_ = (pointer)*plVar24;
      }
      local_168._8_8_ = plVar24[1];
      *plVar24 = (long)pbVar29;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      pmVar22 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar3->shops_config,(key_type *)local_168);
      util::variant::GetString_abi_cxx11_(&local_138.first,pmVar22);
      std::__cxx11::string::operator=((string *)&local_148->shop_name,(string *)&local_138);
      iVar18 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
        operator_delete(local_138.first._M_dataplus._M_p,
                        local_138.first.field_2._M_allocated_capacity + 1);
        iVar18 = extraout_EDX_00;
      }
      if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        iVar18 = extraout_EDX_01;
      }
      if ((NPC_Shop_Craft_Item *)local_d0._0_8_ != (NPC_Shop_Craft_Item *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        iVar18 = extraout_EDX_02;
      }
      pWVar3 = local_148->world;
      util::to_string_abi_cxx11_((string *)local_168,(util *)(ulong)uVar34,iVar18);
      plVar24 = (long *)std::__cxx11::string::append(local_168);
      local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
      psVar30 = (size_type *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar30) {
        local_138.first.field_2._M_allocated_capacity = *psVar30;
        local_138.first.field_2._8_8_ = plVar24[3];
      }
      else {
        local_138.first.field_2._M_allocated_capacity = *psVar30;
        local_138.first._M_dataplus._M_p = (pointer)*plVar24;
      }
      local_138.first._M_string_length = plVar24[1];
      *plVar24 = (long)psVar30;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      iVar20 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&pWVar3->shops_config,&local_138.first);
      iVar18 = extraout_EDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
        operator_delete(local_138.first._M_dataplus._M_p,
                        local_138.first.field_2._M_allocated_capacity + 1);
        iVar18 = extraout_EDX_04;
      }
      if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        iVar18 = extraout_EDX_05;
      }
      if (iVar20.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  (&local_138.first,
                   (variant *)
                   ((long)iVar20.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_168,',',&local_138.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
          operator_delete(local_138.first._M_dataplus._M_p,
                          local_138.first.field_2._M_allocated_capacity + 1);
        }
        uVar36 = (long)(local_168._8_8_ - local_168._0_8_) >> 5;
        if (1 < uVar36) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar36;
          if (0x5555555555555555 < SUB168(auVar11 * ZEXT816(0xaaaaaaaaaaaaaaab),0)) {
            Console::Wrn("skipping invalid trade shop data for vendor #%i",(ulong)uVar34);
            goto LAB_0017f3e6;
          }
          this_01 = &local_148->shop_trade;
          std::
          vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
          ::resize(this_01,uVar36 / 3);
          if (local_168._8_8_ != local_168._0_8_) {
            lVar33 = 0;
            uVar36 = 0;
            do {
              uVar16 = local_168._0_8_;
              puVar25 = (ushort *)operator_new(0xc);
              iVar18 = util::to_int((string *)(uVar16 + lVar33));
              *puVar25 = (ushort)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x20));
              *(int *)(puVar25 + 2) = iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x40));
              *(int *)(puVar25 + 4) = iVar18;
              if (((*(int *)(puVar25 + 2) < iVar18) && (iVar18 != 0)) &&
                 (*(int *)(puVar25 + 2) != 0)) {
                Console::Wrn("item #%i (vendor #%i) has a higher sell price than buy price.",
                             (ulong)*puVar25,(ulong)uVar34);
              }
              auVar12._8_8_ = 0;
              auVar12._0_8_ = uVar36;
              puVar6 = (this_01->
                       super__Vector_base<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar32 = SUB168(auVar12 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe;
              pvVar5 = *(void **)((long)&(puVar6->_M_t).
                                         super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                                         ._M_t + uVar32 * 4);
              *(ushort **)
               ((long)&(puVar6->_M_t).
                       super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                       ._M_t + uVar32 * 4) = puVar25;
              if (pvVar5 != (void *)0x0) {
                operator_delete(pvVar5,0xc);
              }
              uVar36 = uVar36 + 3;
              lVar33 = lVar33 + 0x60;
            } while (uVar36 < (ulong)((long)(local_168._8_8_ - local_168._0_8_) >> 5));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_168);
        iVar18 = extraout_EDX_06;
      }
      pWVar3 = local_148->world;
      util::to_string_abi_cxx11_((string *)local_168,(util *)(ulong)uVar34,iVar18);
      plVar24 = (long *)std::__cxx11::string::append(local_168);
      local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
      psVar30 = (size_type *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar30) {
        local_138.first.field_2._M_allocated_capacity = *psVar30;
        local_138.first.field_2._8_8_ = plVar24[3];
      }
      else {
        local_138.first.field_2._M_allocated_capacity = *psVar30;
        local_138.first._M_dataplus._M_p = (pointer)*plVar24;
      }
      local_138.first._M_string_length = plVar24[1];
      *plVar24 = (long)psVar30;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      iVar20 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&pWVar3->shops_config,&local_138.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
        operator_delete(local_138.first._M_dataplus._M_p,
                        local_138.first.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
      if (iVar20.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  (&local_138.first,
                   (variant *)
                   ((long)iVar20.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_168,',',&local_138.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
          operator_delete(local_138.first._M_dataplus._M_p,
                          local_138.first.field_2._M_allocated_capacity + 1);
        }
        uVar36 = (long)(local_168._8_8_ - local_168._0_8_) >> 5;
        if (1 < uVar36) {
          if (0x1c71c71c71c71c71 < uVar36 * -0x71c71c71c71c71c7) {
            Console::Wrn("skipping invalid craft shop data for vendor #%i",(ulong)uVar34);
            goto LAB_0017f3e6;
          }
          local_140 = &local_148->shop_craft;
          std::
          vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
          ::resize(local_140,uVar36 / 9);
          if (local_168._8_8_ != local_168._0_8_) {
            lVar33 = 0x20;
            uVar36 = 0;
            do {
              local_d0._0_8_ = operator_new(0x20);
              *(char *)(local_d0._0_8_ + 8) = '\0';
              *(char *)(local_d0._0_8_ + 9) = '\0';
              *(char *)(local_d0._0_8_ + 10) = '\0';
              *(char *)(local_d0._0_8_ + 0xb) = '\0';
              *(char *)(local_d0._0_8_ + 0xc) = '\0';
              *(char *)(local_d0._0_8_ + 0xd) = '\0';
              *(char *)(local_d0._0_8_ + 0xe) = '\0';
              *(char *)(local_d0._0_8_ + 0xf) = '\0';
              *(char *)(local_d0._0_8_ + 0x10) = '\0';
              *(char *)(local_d0._0_8_ + 0x11) = '\0';
              *(char *)(local_d0._0_8_ + 0x12) = '\0';
              *(char *)(local_d0._0_8_ + 0x13) = '\0';
              *(char *)(local_d0._0_8_ + 0x14) = '\0';
              *(char *)(local_d0._0_8_ + 0x15) = '\0';
              *(char *)(local_d0._0_8_ + 0x16) = '\0';
              *(char *)(local_d0._0_8_ + 0x17) = '\0';
              *(char *)(local_d0._0_8_ + 0x18) = '\0';
              *(char *)(local_d0._0_8_ + 0x19) = '\0';
              *(char *)(local_d0._0_8_ + 0x1a) = '\0';
              *(char *)(local_d0._0_8_ + 0x1b) = '\0';
              *(char *)(local_d0._0_8_ + 0x1c) = '\0';
              *(char *)(local_d0._0_8_ + 0x1d) = '\0';
              *(char *)(local_d0._0_8_ + 0x1e) = '\0';
              *(char *)(local_d0._0_8_ + 0x1f) = '\0';
              local_138.first.field_2._M_allocated_capacity = 0;
              local_138.first._M_dataplus._M_p = (pointer)0x0;
              local_138.first._M_string_length = 0;
              std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
              resize((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                      *)&local_138,4);
              iVar18 = util::to_int((string *)(local_168._0_8_ + uVar36 * 0x20));
              *(short *)local_d0._0_8_ = (short)iVar18;
              lVar38 = 0;
              lVar37 = lVar33;
              do {
                iVar18 = util::to_int((string *)(local_168._0_8_ + lVar37));
                iVar19 = util::to_int((string *)(local_168._0_8_ + lVar37 + 0x20));
                *(short *)(local_138.first._M_dataplus._M_p + lVar38 * 4) = (short)iVar18;
                local_138.first._M_dataplus._M_p[lVar38 * 4 + 2] = (char)iVar19;
                lVar38 = lVar38 + 1;
                lVar37 = lVar37 + 0x40;
              } while (lVar38 != 4);
              std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
              operator=((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                         *)(local_d0._0_8_ + 8),
                        (vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                         *)&local_138);
              uVar16 = local_d0._0_8_;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = uVar36;
              puVar7 = (local_140->
                       super__Vector_base<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar32 = SUB168(auVar13 * ZEXT816(0xe38e38e38e38e38f),8) & 0xfffffffffffffff8;
              local_d0._0_8_ = (NPC_Shop_Craft_Item *)0x0;
              __ptr = *(NPC_Shop_Craft_Item **)((long)&puVar7->_M_t + uVar32);
              *(undefined8 *)((long)&puVar7->_M_t + uVar32) = uVar16;
              if (__ptr != (NPC_Shop_Craft_Item *)0x0) {
                std::default_delete<NPC_Shop_Craft_Item>::operator()
                          ((default_delete<NPC_Shop_Craft_Item> *)((long)&puVar7->_M_t + uVar32),
                           __ptr);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138.first._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_138.first._M_dataplus._M_p,
                                local_138.first.field_2._M_allocated_capacity -
                                (long)local_138.first._M_dataplus._M_p);
              }
              if ((NPC_Shop_Craft_Item *)local_d0._0_8_ != (NPC_Shop_Craft_Item *)0x0) {
                std::default_delete<NPC_Shop_Craft_Item>::operator()
                          ((default_delete<NPC_Shop_Craft_Item> *)local_d0,
                           (NPC_Shop_Craft_Item *)local_d0._0_8_);
              }
              uVar36 = uVar36 + 9;
              lVar33 = lVar33 + 0x120;
            } while (uVar36 < (ulong)((long)(local_168._8_8_ - local_168._0_8_) >> 5));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_168);
      }
    }
    pWVar3 = local_148->world;
    local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Version","");
    pmVar22 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->skills_config,&local_138.first);
    iVar18 = util::variant::GetInt(pmVar22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
      operator_delete(local_138.first._M_dataplus._M_p,
                      local_138.first.field_2._M_allocated_capacity + 1);
    }
    pNVar17 = local_148;
    pNVar26 = local_148;
    if (1 < iVar18) {
      pEVar23 = ::ENF::Get(local_148->world->enf,(int)local_148->id);
      pNVar26 = (NPC_Data *)&pEVar23->vendor_id;
    }
    sVar2 = pNVar26->id;
    pEVar23 = ::ENF::Get(pNVar17->world->enf,(int)pNVar17->id);
    if ((pEVar23->type == Skills) && (0 < sVar2)) {
      uVar34 = (uint)sVar2;
      pWVar3 = local_148->world;
      util::to_string_abi_cxx11_((string *)local_d0,(util *)(ulong)uVar34,subject_01);
      plVar24 = (long *)std::__cxx11::string::append((char *)local_d0);
      pbVar29 = (pointer)(local_168 + 0x10);
      pbVar31 = (pointer)(plVar24 + 2);
      if ((pointer)*plVar24 == pbVar31) {
        local_168._16_8_ = (pbVar31->_M_dataplus)._M_p;
        local_168._24_8_ = plVar24[3];
        local_168._0_8_ = pbVar29;
      }
      else {
        local_168._16_8_ = (pbVar31->_M_dataplus)._M_p;
        local_168._0_8_ = (pointer)*plVar24;
      }
      local_168._8_8_ = plVar24[1];
      *plVar24 = (long)pbVar31;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      pmVar22 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar3->skills_config,(key_type *)local_168);
      util::variant::GetString_abi_cxx11_(&local_138.first,pmVar22);
      std::__cxx11::string::operator=((string *)&local_148->skill_name,(string *)&local_138);
      iVar18 = extraout_EDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
        operator_delete(local_138.first._M_dataplus._M_p,
                        local_138.first.field_2._M_allocated_capacity + 1);
        iVar18 = extraout_EDX_08;
      }
      if ((pointer)local_168._0_8_ != pbVar29) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        iVar18 = extraout_EDX_09;
      }
      if ((NPC_Shop_Craft_Item *)local_d0._0_8_ != (NPC_Shop_Craft_Item *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        iVar18 = extraout_EDX_10;
      }
      pWVar3 = local_148->world;
      util::to_string_abi_cxx11_((string *)local_168,(util *)(ulong)uVar34,iVar18);
      plVar24 = (long *)std::__cxx11::string::append(local_168);
      local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
      psVar30 = (size_type *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar30) {
        local_138.first.field_2._M_allocated_capacity = *psVar30;
        local_138.first.field_2._8_8_ = plVar24[3];
      }
      else {
        local_138.first.field_2._M_allocated_capacity = *psVar30;
        local_138.first._M_dataplus._M_p = (pointer)*plVar24;
      }
      local_138.first._M_string_length = plVar24[1];
      *plVar24 = (long)psVar30;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      iVar20 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&pWVar3->skills_config,&local_138.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
        operator_delete(local_138.first._M_dataplus._M_p,
                        local_138.first.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_168._0_8_ != pbVar29) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
      }
      if (iVar20.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  (&local_138.first,
                   (variant *)
                   ((long)iVar20.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_168,',',&local_138.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
          operator_delete(local_138.first._M_dataplus._M_p,
                          local_138.first.field_2._M_allocated_capacity + 1);
        }
        uVar36 = (long)(local_168._8_8_ - local_168._0_8_) >> 5;
        if (1 < uVar36) {
          if (0x1249249249249249 <
              (uVar36 * 0x6db6db6db6db6db7 >> 1 |
              (ulong)((uVar36 * 0x6db6db6db6db6db7 & 1) != 0) << 0x3f)) {
            Console::Err("WARNING: skipping invalid skill learn data for vendor #%i",(ulong)uVar34);
            goto LAB_0017f3e6;
          }
          this_02 = &local_148->skill_learn;
          std::
          vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
          ::resize(this_02,uVar36 / 0xe);
          if (local_168._8_8_ != local_168._0_8_) {
            lVar33 = 0;
            uVar36 = 0;
            do {
              uVar16 = local_168._0_8_;
              puVar21 = (undefined2 *)operator_new(0x20);
              iVar18 = util::to_int((string *)(uVar16 + lVar33));
              *puVar21 = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x20));
              *(int *)(puVar21 + 2) = iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x40));
              *(char *)(puVar21 + 4) = (char)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x60));
              *(char *)((long)puVar21 + 9) = (char)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x80));
              puVar21[5] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0xa0));
              puVar21[6] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0xc0));
              puVar21[7] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0xe0));
              puVar21[8] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x100));
              puVar21[9] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x120));
              puVar21[10] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x140));
              puVar21[0xb] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x160));
              puVar21[0xc] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x180));
              puVar21[0xd] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x1a0));
              puVar21[0xe] = (short)iVar18;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = uVar36 >> 1;
              puVar8 = (this_02->
                       super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar32 = SUB168(auVar14 * ZEXT816(0x4924924924924925),8) & 0xfffffffffffffffe;
              pvVar5 = *(void **)((long)&(puVar8->_M_t).
                                         super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                         ._M_t + uVar32 * 4);
              *(undefined2 **)
               ((long)&(puVar8->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t + uVar32 * 4) = puVar21;
              if (pvVar5 != (void *)0x0) {
                operator_delete(pvVar5,0x20);
              }
              uVar36 = uVar36 + 0xe;
              lVar33 = lVar33 + 0x1c0;
            } while (uVar36 < (ulong)((long)(local_168._8_8_ - local_168._0_8_) >> 5));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_168);
      }
    }
    pWVar3 = local_148->world;
    local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Version","");
    pmVar22 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->home_config,&local_138.first);
    iVar18 = util::variant::GetInt(pmVar22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
      operator_delete(local_138.first._M_dataplus._M_p,
                      local_138.first.field_2._M_allocated_capacity + 1);
    }
    pNVar17 = local_148;
    pNVar26 = local_148;
    if (1 < iVar18) {
      pEVar23 = ::ENF::Get(local_148->world->enf,(int)local_148->id);
      pNVar26 = (NPC_Data *)&pEVar23->vendor_id;
    }
    sVar2 = pNVar26->id;
    pEVar23 = ::ENF::Get(pNVar17->world->enf,(int)pNVar17->id);
    if ((pEVar23->type == Inn) && (0 < sVar2)) {
      local_140 = (vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                   *)CONCAT44(local_140._4_4_,(int)sVar2);
      this_03 = &local_148->citizenship;
      do {
        p_Var35 = (local_148->world->home_config).
                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  ._M_h._M_before_begin._M_nxt;
        while( true ) {
          if (p_Var35 == (_Hash_node_base *)0x0) {
            return;
          }
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
          ::pair(&local_138,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                  *)(p_Var35 + 1));
          util::explode(&local_90,'.',&local_138.first);
          iVar18 = 0x13;
          if (0x20 < (ulong)((long)local_90.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_90.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            if (((NPC_Citizenship *)
                 (this_03->_M_t).
                 super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
                 super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
                 super__Head_base<0UL,_NPC_Citizenship_*,_false> == (NPC_Citizenship *)0x0) &&
               (iVar18 = std::__cxx11::string::compare
                                   ((char *)(local_90.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1)),
               iVar18 == 0)) {
              util::variant::GetString_abi_cxx11_((string *)local_168,&local_138.second);
              iVar18 = util::to_int((string *)local_168);
              bVar39 = iVar18 == (int)local_140;
              bVar15 = true;
            }
            else {
              bVar15 = false;
              bVar39 = false;
            }
            if ((bVar15) && ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10))) {
              operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
            }
            pbVar29 = local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (bVar39) {
              _Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl =
                   (_Head_base<0UL,_NPC_Citizenship_*,_false>)operator_new(0xe0);
              *(long **)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl =
                   (long *)((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>.
                                  _M_head_impl + 0x10);
              *(long *)((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl +
                       8) = 0;
              *(undefined1 *)
               ((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl + 0x10) =
                   0;
              lVar33 = 0x30;
              do {
                *(long *)((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl
                         + lVar33 + -0x10) =
                     (long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl +
                     lVar33;
                *(undefined8 *)
                 ((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl +
                 lVar33 + -8) = 0;
                *(undefined1 *)
                 ((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl + lVar33
                 ) = 0;
                lVar33 = lVar33 + 0x20;
              } while (lVar33 != 0x90);
              lVar33 = 0x90;
              do {
                *(long *)((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl
                         + lVar33 + -0x10) =
                     (long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl +
                     lVar33;
                *(undefined8 *)
                 ((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl +
                 lVar33 + -8) = 0;
                *(undefined1 *)
                 ((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl + lVar33
                 ) = 0;
                lVar33 = lVar33 + 0x20;
              } while (lVar33 != 0xf0);
              __ptr_00.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl =
                   (this_03->_M_t).
                   super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
                   super__Head_base<0UL,_NPC_Citizenship_*,_false>;
              (this_03->_M_t).
              super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
              super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
              super__Head_base<0UL,_NPC_Citizenship_*,_false> =
                   _Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl;
              if (__ptr_00.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl !=
                  (NPC_Citizenship *)0x0) {
                std::default_delete<NPC_Citizenship>::operator()
                          ((default_delete<NPC_Citizenship> *)this_03,
                           (NPC_Citizenship *)
                           __ptr_00.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl);
              }
              std::__cxx11::string::_M_assign
                        ((string *)
                         (this_03->_M_t).
                         super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                         .super__Head_base<0UL,_NPC_Citizenship_*,_false>);
              _Var9._M_head_impl =
                   (local_148->citizenship)._M_t.
                   super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
                   super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl;
              pWVar3 = local_148->world;
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              lVar33 = *(long *)&(_Var9._M_head_impl)->home;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_78,lVar33,
                         *(size_type *)((long)&(_Var9._M_head_impl)->home + 8) + lVar33);
              pHVar28 = World::GetHome(pWVar3,&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if (pHVar28 == (Home *)0x0) {
                Console::Wrn("Vendor #%i\'s innkeeper set on non-existent home: %s",
                             (ulong)local_140 & 0xffffffff,
                             *(undefined8 *)
                              (this_03->_M_t).
                              super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                              .super__Head_base<0UL,_NPC_Citizenship_*,_false>);
                iVar18 = 0x11;
              }
              else {
                pEVar23 = ::ENF::Get(local_148->world->enf,(int)local_148->id);
                pHVar28->innkeeper_vend = (int)pEVar23->vendor_id;
                iVar18 = 0x11;
              }
            }
            else {
              _Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl =
                   (this_03->_M_t).
                   super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
                   super__Head_base<0UL,_NPC_Citizenship_*,_false>;
              if (((_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl ==
                    (NPC_Citizenship *)0x0) ||
                  (sVar10 = *(size_t *)
                             ((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>.
                                    _M_head_impl + 8),
                  sVar10 != (local_90.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)) ||
                 ((sVar10 != 0 &&
                  (iVar18 = bcmp(*(void **)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>.
                                           _M_head_impl,
                                 ((local_90.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                                 sVar10), iVar18 != 0)))) {
                bVar15 = false;
                bVar39 = false;
              }
              else {
                std::__cxx11::string::substr((ulong)local_d0,(ulong)(pbVar29 + 1));
                iVar18 = std::__cxx11::string::compare(local_d0);
                bVar39 = iVar18 == 0;
                bVar15 = true;
              }
              if ((bVar15) &&
                 ((NPC_Shop_Craft_Item *)local_d0._0_8_ != (NPC_Shop_Craft_Item *)(local_d0 + 0x10))
                 ) {
                operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
              }
              pbVar29 = local_90.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (bVar39) {
                cVar1 = local_90.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                        [local_90.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length - 1];
                if ((byte)(cVar1 - 0x34U) < 0xfd) {
                  util::variant::GetString_abi_cxx11_(&local_b0,&local_138.second);
                  Console::Wrn("Exactly 3 questions must be specified for %s innkeeper vendor #%i",
                               local_b0._M_dataplus._M_p,(ulong)local_140 & 0xffffffff);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p,
                                    local_b0.field_2._M_allocated_capacity + 1);
                  }
                }
                util::variant::GetString_abi_cxx11_(&local_b0,&local_138.second);
                std::__cxx11::string::operator=
                          ((string *)
                           ((long)(this_03->_M_t).
                                  super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                                  .super__Head_base<0UL,_NPC_Citizenship_*,_false> +
                            ((long)cVar1 + -0x31) * 0x20 + 0x20),(string *)&local_b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,
                                  local_b0.field_2._M_allocated_capacity + 1);
                }
                iVar18 = 0;
              }
              else {
                _Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl =
                     (this_03->_M_t).
                     super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                     .super__Head_base<0UL,_NPC_Citizenship_*,_false>;
                if (((_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl ==
                      (NPC_Citizenship *)0x0) ||
                    (sVar10 = *(size_t *)
                               ((long)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>.
                                      _M_head_impl + 8),
                    sVar10 != (local_90.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)) ||
                   ((sVar10 != 0 &&
                    (iVar18 = bcmp(*(void **)_Var27.super__Head_base<0UL,_NPC_Citizenship_*,_false>.
                                             _M_head_impl,
                                   ((local_90.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                                   sVar10), iVar18 != 0)))) {
                  bVar15 = false;
                  bVar39 = false;
                }
                else {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)(pbVar29 + 1));
                  iVar18 = std::__cxx11::string::compare((char *)local_50);
                  bVar39 = iVar18 == 0;
                  bVar15 = true;
                }
                if ((bVar15) && (local_50[0] != local_40)) {
                  operator_delete(local_50[0],local_40[0] + 1);
                }
                iVar18 = 0;
                if (bVar39) {
                  cVar1 = local_90.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                          [local_90.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length - 1];
                  if ((byte)(cVar1 - 0x34U) < 0xfd) {
                    util::variant::GetString_abi_cxx11_(&local_b0,&local_138.second);
                    Console::Wrn("Exactly 3 answers must be specified for %s innkeeper vendor #%i",
                                 local_b0._M_dataplus._M_p,(ulong)local_140 & 0xffffffff);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  util::variant::GetString_abi_cxx11_(&local_b0,&local_138.second);
                  std::__cxx11::string::operator=
                            ((string *)
                             ((long)(this_03->_M_t).
                                    super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                                    .super__Head_base<0UL,_NPC_Citizenship_*,_false> +
                              ((long)cVar1 + -0x31) * 0x20 + 0x80),(string *)&local_b0);
                  iVar18 = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p,
                                    local_b0.field_2._M_allocated_capacity + 1);
                    iVar18 = 0;
                  }
                }
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.second.val_string._M_dataplus._M_p !=
              &local_138.second.val_string.field_2) {
            operator_delete(local_138.second.val_string._M_dataplus._M_p,
                            local_138.second.val_string.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
            operator_delete(local_138.first._M_dataplus._M_p,
                            local_138.first.field_2._M_allocated_capacity + 1);
          }
          if ((iVar18 != 0x13) && (iVar18 != 0)) break;
          p_Var35 = p_Var35->_M_nxt;
        }
      } while (p_Var35 != (_Hash_node_base *)0x0);
    }
  }
  else {
    util::variant::GetString_abi_cxx11_
              (&local_138.first,
               (variant *)
               ((long)iVar20.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                      ._M_cur + 0x28));
    util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_168,',',&local_138.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
      operator_delete(local_138.first._M_dataplus._M_p,
                      local_138.first.field_2._M_allocated_capacity + 1);
    }
    uVar36 = (long)(local_168._8_8_ - local_168._0_8_) >> 5;
    if (uVar36 < 2) {
LAB_0017e9fb:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168);
      goto LAB_0017ea03;
    }
    if ((local_168._8_8_ - local_168._0_8_ & 0x60) == 0) {
      this_00 = &local_148->drops;
      std::
      vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
      ::resize(this_00,uVar36 >> 2);
      if (local_168._8_8_ == local_168._0_8_) {
        local_140 = (vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                     *)0x0;
      }
      else {
        local_140 = (vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                     *)0x0;
        lVar33 = 0;
        uVar36 = 0;
        do {
          uVar16 = local_168._0_8_;
          puVar21 = (undefined2 *)operator_new(0x20);
          iVar18 = util::to_int((string *)(uVar16 + lVar33));
          *puVar21 = (short)iVar18;
          iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x20));
          *(int *)(puVar21 + 2) = iVar18;
          iVar18 = util::to_int((string *)(local_168._0_8_ + lVar33 + 0x40));
          *(int *)(puVar21 + 4) = iVar18;
          dVar40 = util::to_float((string *)(local_168._0_8_ + lVar33 + 0x60));
          *(double *)(puVar21 + 8) = dVar40;
          *(vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
            **)(puVar21 + 0xc) = local_140;
          puVar4 = (this_00->
                   super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar5 = *(void **)((long)&(puVar4->_M_t).
                                     super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                                     ._M_t + uVar36 * 2);
          *(undefined2 **)
           ((long)&(puVar4->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                   _M_t + uVar36 * 2) = puVar21;
          if (pvVar5 != (void *)0x0) {
            local_58 = dVar40;
            operator_delete(pvVar5,0x20);
            dVar40 = local_58;
          }
          local_140 = (vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                       *)((double)local_140 + dVar40);
          uVar36 = uVar36 + 4;
          lVar33 = lVar33 + 0x80;
        } while (uVar36 < (ulong)((long)(local_168._8_8_ - local_168._0_8_) >> 5));
      }
      if ((double)local_140 <= 100.001) {
        local_148->drops_chance_total = 100.0;
      }
      else {
        local_148->drops_chance_total = (double)local_140;
        pWVar3 = local_148->world;
        local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"DropRateMode","");
        pmVar22 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar3->config,&local_138.first);
        iVar18 = util::variant::GetInt(pmVar22);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
          operator_delete(local_138.first._M_dataplus._M_p,
                          local_138.first.field_2._M_allocated_capacity + 1);
        }
        if (iVar18 == 3) {
          Console::Wrn("Drop rates for NPC #%i add up to %g%%. They have been scaled down proportionally."
                       ,local_148->drops_chance_total,(ulong)(uint)(int)local_148->id);
        }
      }
      goto LAB_0017e9fb;
    }
    Console::Wrn("skipping invalid drop data for NPC #%i",(ulong)(uint)(int)local_148->id);
LAB_0017f3e6:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168);
  }
  return;
}

Assistant:

void NPC_Data::LoadShopDrop()
{
	this->UnloadShopDrop();

	Config::iterator drops = this->world->drops_config.find(util::to_string(this->id));
	if (drops != this->world->drops_config.end())
	{
		std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*drops).second));

		if (parts.size() > 1)
		{
			if (parts.size() % 4 != 0)
			{
				Console::Wrn("skipping invalid drop data for NPC #%i", id);
				return;
			}

			double chance_offset = 0.0;

			this->drops.resize(parts.size() / 4);

			for (std::size_t i = 0; i < parts.size(); i += 4)
			{
				std::unique_ptr<NPC_Drop> drop(new NPC_Drop);

				drop->id = util::to_int(parts[i]);
				drop->min = util::to_int(parts[i+1]);
				drop->max = util::to_int(parts[i+2]);
				drop->chance = util::to_float(parts[i+3]);
				drop->chance_offset = chance_offset;

				chance_offset += drop->chance;

				this->drops[i/4] = std::move(drop);
			}

			if (chance_offset > 100.001)
			{
				this->drops_chance_total = chance_offset;

				if (static_cast<int>(this->world->config["DropRateMode"]) == 3)
					Console::Wrn("Drop rates for NPC #%i add up to %g%%. They have been scaled down proportionally.", this->id, this->drops_chance_total);
			}
			else
			{
				this->drops_chance_total = 100.0;
			}
		}
	}

	short shop_vend_id;

	if (int(this->world->shops_config["Version"]) < 2)
	{
		shop_vend_id = this->id;
	}
	else
	{
		shop_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Shop && shop_vend_id > 0)
	{
		this->shop_name = static_cast<std::string>(this->world->shops_config[util::to_string(shop_vend_id) + ".name"]);
		Config::iterator shops = this->world->shops_config.find(util::to_string(shop_vend_id) + ".trade");
		if (shops != this->world->shops_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*shops).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 3 != 0)
				{
					Console::Wrn("skipping invalid trade shop data for vendor #%i", shop_vend_id);
					return;
				}

				this->shop_trade.resize(parts.size() / 3);

				for (std::size_t i = 0; i < parts.size(); i += 3)
				{
					std::unique_ptr<NPC_Shop_Trade_Item> item(new NPC_Shop_Trade_Item);
					item->id = util::to_int(parts[i]);
					item->buy = util::to_int(parts[i+1]);
					item->sell = util::to_int(parts[i+2]);

					if (item->buy != 0 && item->sell != 0 && item->sell > item->buy)
					{
						Console::Wrn("item #%i (vendor #%i) has a higher sell price than buy price.", item->id, shop_vend_id);
					}

					this->shop_trade[i/3] = std::move(item);
				}
			}
		}

		shops = this->world->shops_config.find(util::to_string(shop_vend_id) + ".craft");
		if (shops != this->world->shops_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*shops).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 9 != 0)
				{
					Console::Wrn("skipping invalid craft shop data for vendor #%i", shop_vend_id);
					return;
				}

				this->shop_craft.resize(parts.size() / 9);

				for (std::size_t i = 0; i < parts.size(); i += 9)
				{
					std::unique_ptr<NPC_Shop_Craft_Item> item(new NPC_Shop_Craft_Item);
					std::vector<NPC_Shop_Craft_Ingredient> ingredients;
					ingredients.resize(4);

					item->id = util::to_int(parts[i]);

					for (int ii = 0; ii < 4; ++ii)
					{
						NPC_Shop_Craft_Ingredient ingredient;
						ingredient.id = util::to_int(parts[i+1+ii*2]);
						ingredient.amount = util::to_int(parts[i+2+ii*2]);
						ingredients[ii] = ingredient;
					}

					item->ingredients = ingredients;

					this->shop_craft[i/9] = std::move(item);
				}
			}
		}
	}

	short skills_vend_id;

	if (int(this->world->skills_config["Version"]) < 2)
	{
		skills_vend_id = this->id;
	}
	else
	{
		skills_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Skills && skills_vend_id > 0)
	{
		this->skill_name = static_cast<std::string>(this->world->skills_config[util::to_string(skills_vend_id) + ".name"]);
		Config::iterator skills = this->world->skills_config.find(util::to_string(skills_vend_id) + ".learn");
		if (skills != this->world->skills_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*skills).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 14 != 0)
				{
					Console::Err("WARNING: skipping invalid skill learn data for vendor #%i", skills_vend_id);
					return;
				}

				this->skill_learn.resize(parts.size() / 14);

				for (std::size_t i = 0; i < parts.size(); i += 14)
				{
					std::unique_ptr<NPC_Learn_Skill> skill(new NPC_Learn_Skill);

					skill->id = util::to_int(parts[i]);
					skill->cost = util::to_int(parts[i+1]);
					skill->levelreq = util::to_int(parts[i+2]);
					skill->classreq = util::to_int(parts[i+3]);

					skill->skillreq[0] = util::to_int(parts[i+4]);
					skill->skillreq[1] = util::to_int(parts[i+5]);
					skill->skillreq[2] = util::to_int(parts[i+6]);
					skill->skillreq[3] = util::to_int(parts[i+7]);

					skill->strreq = util::to_int(parts[i+8]);
					skill->intreq = util::to_int(parts[i+9]);
					skill->wisreq = util::to_int(parts[i+10]);
					skill->agireq = util::to_int(parts[i+11]);
					skill->conreq = util::to_int(parts[i+12]);
					skill->chareq = util::to_int(parts[i+13]);

					this->skill_learn[i/14] = std::move(skill);
				}
			}
		}
	}

	short home_vend_id;

	if (int(this->world->home_config["Version"]) < 2)
	{
		home_vend_id = this->id;
	}
	else
	{
		home_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Inn && home_vend_id > 0)
	{
		restart_loop:
		UTIL_FOREACH(this->world->home_config, hc)
		{
			std::vector<std::string> parts = util::explode('.', hc.first);

			if (parts.size() < 2)
			{
				continue;
			}

			if (!this->citizenship && parts[1] == "innkeeper" && util::to_int(hc.second) == home_vend_id)
			{
				this->citizenship.reset(new NPC_Citizenship);
				this->citizenship->home = parts[0];
				Home* home = this->world->GetHome(this->citizenship->home);

				if (home)
					home->innkeeper_vend = this->ENF().vendor_id;
				else
					Console::Wrn("Vendor #%i's innkeeper set on non-existent home: %s", home_vend_id, this->citizenship->home.c_str());

				// Restart the loop so questions/answers specified before the innkeeper option will load
				goto restart_loop;
			}
			else if (this->citizenship && this->citizenship->home == parts[0] && parts[1].substr(0, parts[1].length() - 1) == "question")
			{
				int index = parts[1][parts[1].length() - 1] - '1';

				if (index < 0 || index >= 3)
				{
					Console::Wrn("Exactly 3 questions must be specified for %s innkeeper vendor #%i", std::string(hc.second).c_str(), home_vend_id);
				}

				this->citizenship->questions[index] = static_cast<std::string>(hc.second);
			}
			else if (this->citizenship && this->citizenship->home == parts[0] && parts[1].substr(0, parts[1].length() - 1) == "answer")
			{
				int index = parts[1][parts[1].length() - 1] - '1';

				if (index < 0 || index >= 3)
				{
					Console::Wrn("Exactly 3 answers must be specified for %s innkeeper vendor #%i", std::string(hc.second).c_str(), home_vend_id);
				}

				this->citizenship->answers[index] = static_cast<std::string>(hc.second);
			}
		}
	}
}